

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O2

ConstantValue * __thiscall
slang::ast::builtins::QueueInsertMethod::eval
          (ConstantValue *__return_storage_ptr__,QueueInsertMethod *this,EvalContext *context,
          Args *args,SourceRange param_3,SystemCallInfo *param_4)

{
  SVQueue *this_00;
  variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *__v;
  variant_alternative_t<8UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar1;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this_01;
  optional<int> oVar2;
  size_type sVar3;
  Diagnostic *pDVar4;
  ulong __n;
  ConstantValue cv;
  LValue lval;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  _Stack_288;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_260;
  _Self local_238;
  _Self local_218;
  const_iterator local_1f8;
  iterator local_1d0;
  _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
  local_1b0;
  
  Expression::evalLValue((LValue *)&local_1b0,*args->_M_ptr,context);
  Expression::eval((ConstantValue *)&_Stack_288,args->_M_ptr[1],context);
  Expression::eval((ConstantValue *)&local_260,args->_M_ptr[2],context);
  if (((local_1b0._M_index != '\0') && (_Stack_288._M_index != '\0')) &&
     (local_260._M_index != '\0')) {
    __v = &LValue::resolve((LValue *)&local_1b0)->value;
    pvVar1 = std::
             get<8ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                       (__v);
    this_00 = pvVar1->ptr;
    this_01 = std::
              get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          *)&_Stack_288);
    oVar2 = SVInt::as<int>(this_01);
    if (((ulong)oVar2.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> & 0x180000000) == 0x100000000) {
      __n = (ulong)(oVar2.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int>._M_payload & 0x7fffffff);
      sVar3 = std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                        (&this_00->
                          super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>);
      if (__n < sVar3 + 1) {
        local_238._M_cur =
             (this_00->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
             super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
        local_238._M_first =
             (this_00->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
             super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
             super__Deque_impl_data._M_start._M_first;
        local_238._M_last =
             (this_00->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
             super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
        local_238._M_node =
             (this_00->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
             super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
        std::operator+(&local_218,&local_238,__n);
        local_1f8._M_cur = local_218._M_cur;
        local_1f8._M_first = local_218._M_first;
        local_1f8._M_last = local_218._M_last;
        local_1f8._M_node = local_218._M_node;
        std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::insert
                  (&local_1d0,
                   &this_00->
                    super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,
                   &local_1f8,(value_type *)&local_260);
        SVQueue::resizeToBound(this_00);
        goto LAB_0038be5d;
      }
    }
    pDVar4 = EvalContext::addDiag(context,(DiagCode)0x23000c,args->_M_ptr[1]->sourceRange);
    pDVar4 = Diagnostic::operator<<(pDVar4,(ConstantValue *)&_Stack_288);
    pDVar4 = ast::operator<<(pDVar4,((*args->_M_ptr)->type).ptr);
    sVar3 = std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                      (&this_00->
                        super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>);
    Diagnostic::operator<<<unsigned_long>(pDVar4,sVar3 + 1);
  }
LAB_0038be5d:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
   + 0x20) = '\0';
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_260);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&_Stack_288);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>::
  ~_Variant_storage(&local_1b0);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto lval = args[0]->evalLValue(context);
        auto ci = args[1]->eval(context);
        auto cv = args[2]->eval(context);
        if (!lval || !ci || !cv)
            return nullptr;

        auto target = lval.resolve();
        SLANG_ASSERT(target && target->isQueue());

        auto& q = *target->queue();
        std::optional<int32_t> index = ci.integer().as<int32_t>();
        if (!index || *index < 0 || size_t(*index) >= q.size() + 1) {
            context.addDiag(diag::ConstEvalDynamicArrayIndex, args[1]->sourceRange)
                << ci << *args[0]->type << q.size() + 1;
            return nullptr;
        }

        q.insert(q.begin() + *index, std::move(cv));
        q.resizeToBound();
        return nullptr;
    }